

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O0

void __thiscall
HookStateStepIn::ProcessHook
          (HookStateStepIn *this,shared_ptr<Debugger> *debugger,lua_State *L,lua_Debug *ar)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  shared_ptr<Debugger> local_60;
  char *local_50;
  char *source;
  int currentLine;
  shared_ptr<Debugger> local_38;
  lua_Debug *local_28;
  lua_Debug *ar_local;
  lua_State *L_local;
  shared_ptr<Debugger> *debugger_local;
  HookStateStepIn *this_local;
  
  local_28 = ar;
  ar_local = (lua_Debug *)L;
  L_local = (lua_State *)debugger;
  debugger_local = (shared_ptr<Debugger> *)this;
  std::shared_ptr<Debugger>::shared_ptr(&local_38,debugger);
  StackLevelBasedState::UpdateStackLevel
            (&this->super_StackLevelBasedState,&local_38,(lua_State *)ar_local,local_28);
  std::shared_ptr<Debugger>::~shared_ptr(&local_38);
  iVar2 = getDebugEvent(local_28);
  if (iVar2 == 2) {
    (*lua_getinfo)((lua_State *)ar_local,"nSl",local_28);
    source._0_4_ = getDebugCurrentLine(local_28);
    local_50 = getDebugSource(local_28);
    if (((int)source != this->line) || (bVar1 = std::operator!=(&this->file,local_50), bVar1)) {
      this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)debugger);
      Debugger::HandleBreak(this_00);
    }
  }
  else {
    std::shared_ptr<Debugger>::shared_ptr(&local_60,debugger);
    HookState::ProcessHook((HookState *)this,&local_60,(lua_State *)ar_local,local_28);
    std::shared_ptr<Debugger>::~shared_ptr(&local_60);
  }
  return;
}

Assistant:

void HookStateStepIn::ProcessHook(std::shared_ptr<Debugger> debugger, lua_State* L, lua_Debug* ar)
{
	UpdateStackLevel(debugger, L, ar);
	if (getDebugEvent(ar) == LUA_HOOKLINE)
	{
		lua_getinfo(L, "nSl", ar);
		auto currentLine = getDebugCurrentLine(ar);
		auto source = getDebugSource(ar);
		if(currentLine != line || file != source)
		{
			debugger->HandleBreak();
		}
		return;
	}

	StackLevelBasedState::ProcessHook(debugger, L, ar);
}